

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O1

bool __thiscall sptk::ScalarOperation::AddNaturalExponentialOperation(ScalarOperation *this)

{
  pointer *pppMVar1;
  iterator __position;
  ModuleInterface *pMVar2;
  _func_int **pp_Var3;
  ModuleInterface *local_18;
  
  pMVar2 = (ModuleInterface *)operator_new(0x10);
  pp_Var3 = (_func_int **)operator_new(8);
  *pp_Var3 = (_func_int *)&PTR__OperationInterface_00114828;
  pMVar2->_vptr_ModuleInterface = (_func_int **)&PTR__OperationPerformer_001144a8;
  pMVar2[1]._vptr_ModuleInterface = pp_Var3;
  __position._M_current =
       (this->modules_).
       super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->modules_).
      super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18 = pMVar2;
    std::
    vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
    ::_M_realloc_insert<sptk::ScalarOperation::ModuleInterface*>
              ((vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
                *)&this->modules_,__position,&local_18);
  }
  else {
    *__position._M_current = pMVar2;
    pppMVar1 = &(this->modules_).
                super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppMVar1 = *pppMVar1 + 1;
  }
  return true;
}

Assistant:

bool ScalarOperation::AddNaturalExponentialOperation() {
  modules_.push_back(new OperationPerformer(new NaturalExponential()));
  return true;
}